

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchTree.h
# Opt level: O1

Node<int> * __thiscall SearchTree::find(SearchTree *this,int *target)

{
  int iVar1;
  undefined8 in_RAX;
  undefined4 extraout_var;
  long *plVar2;
  Node<int> *pNVar3;
  undefined4 extraout_var_01;
  int *piVar4;
  undefined4 extraout_var_02;
  bool leftFlag;
  char local_11;
  undefined4 extraout_var_00;
  
  local_11 = (char)((ulong)in_RAX >> 0x38);
  iVar1 = (*(this->super_Tree<int>)._vptr_Tree[8])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*(this->super_Tree<int>)._vptr_Tree[0xb])(this,target,&local_11);
    plVar2 = (long *)CONCAT44(extraout_var_00,iVar1);
    if (plVar2 != (long *)0x0) {
      if (local_11 == '\x01') {
        pNVar3 = (Node<int> *)(**(code **)*plVar2)(plVar2);
        return pNVar3;
      }
      pNVar3 = (Node<int> *)(*(code *)((undefined8 *)*plVar2)[8])(plVar2);
      return pNVar3;
    }
    iVar1 = (*(this->super_Tree<int>)._vptr_Tree[8])(this);
    piVar4 = (int *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x20))
                              ((long *)CONCAT44(extraout_var_01,iVar1));
    if (*piVar4 == *target) {
      iVar1 = (*(this->super_Tree<int>)._vptr_Tree[8])(this);
      return (Node<int> *)CONCAT44(extraout_var_02,iVar1);
    }
  }
  return (Node<int> *)0x0;
}

Assistant:

virtual Node<int>* find(int& target){
        if (getRoot() == nullptr){
            return nullptr;
        }
        bool leftFlag;
        //找寻父节点
        Node<int>* node = getParent(target, leftFlag);
        //如果是根节点
        if (node == nullptr){
            if (getRoot()->getDataNode() == target){
                return getRoot();
            }
            return nullptr;
        }
        if (leftFlag){
            node = node->getLeftPoint();
        } else{
            node = node->getRightPoint();
        }
        return node;
    }